

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of-test.c++
# Opt level: O2

void __thiscall kj::TestCase101::run(TestCase101 *this)

{
  undefined8 uVar1;
  anon_union_8_2_a774ebf0_for_OneOf<int,_float,_const_char_*>_3 aVar2;
  bool bVar3;
  size_t sVar4;
  int iVar5;
  Fault f;
  undefined1 local_70 [16];
  Fault f_2;
  OneOf<int,_float,_const_char_*> var;
  StringPtr local_40;
  
  var.tag = 0;
  f.exception._0_4_ = 3;
  local_70._0_8_ = (long)"HTTP/1.1 200 OK\r\nContent-Length: 32\r\n\r\nfoo" + 0x27;
  uVar1 = local_70._0_8_;
  local_70._0_4_ = 0x357ec7;
  OneOf<int,_float,_const_char_*>::operator=(&var,(OneOf<int,_float,_const_char_*> *)&f);
  if (var.tag == 3) {
    iVar5 = 1;
    local_70._0_8_ = uVar1;
    while (aVar2 = var.field_1, bVar3 = iVar5 != 0, iVar5 = iVar5 + -1, bVar3) {
      sVar4 = strlen((char *)var.field_1.forceAligned);
      local_70._0_8_ = sVar4 + 1;
      f.exception = (Exception *)aVar2;
      f_2.exception = (Exception *)0x357ec7;
      bVar3 = StringPtr::operator==((StringPtr *)&f,(StringPtr *)&f_2);
      if ((!bVar3) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[43]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                   ,0x70,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\"",
                   (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"");
      }
    }
  }
  else {
    if (var.tag == 2) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x74,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",(float *)&var.field_1);
      _::Debug::Fault::fatal(&f);
    }
    if (var.tag == 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x6d,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)var.field_1.space);
      _::Debug::Fault::fatal(&f);
    }
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x79,ERROR,"\"failed: expected \" \"count == 1\"",
                 (char (*) [28])"failed: expected count == 1");
    }
  }
  cp<kj::OneOf<int,float,char_const*>>((kj *)&f_2,&var);
  _::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::NullableValue
            ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)&f,
             (OneOf<int,_float,_const_char_*> *)&f_2);
  if (local_70._0_4_ == 3) {
    strlen((char *)local_70._8_8_);
    f_2.exception = (Exception *)local_70._8_8_;
    local_40.content.ptr = "foo";
    local_40.content.size_ = 4;
    bVar3 = StringPtr::operator==((StringPtr *)&f_2,&local_40);
    if (!bVar3 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x81,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\"",
                 (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"");
    }
  }
  else {
    if (local_70._0_4_ == 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int&>
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x7e,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)(local_70 + 8));
      _::Debug::Fault::fatal(&f_2);
    }
    if (local_70._0_4_ == 2) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float&>
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x84,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",(float *)(local_70 + 8));
      _::Debug::Fault::fatal(&f_2);
    }
  }
  if (var.tag == 3) {
    strlen((char *)var.field_1.forceAligned);
    f.exception = (Exception *)var.field_1;
    f_2.exception = (Exception *)0x357ec7;
    bVar3 = StringPtr::operator==((StringPtr *)&f,(StringPtr *)&f_2);
    if ((!bVar3) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x91,ERROR,"\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\"",
                 (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"");
    }
  }
  else {
    if (var.tag == 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int_const&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x8e,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)var.field_1.space);
      _::Debug::Fault::fatal(&f);
    }
    if (var.tag == 2) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float_const&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x94,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",(float *)&var.field_1);
      _::Debug::Fault::fatal(&f);
    }
  }
  return;
}

Assistant:

TEST(OneOf, Switch) {
  OneOf<int, float, const char*> var;
  var = "foo";
  uint count = 0;

  {
    KJ_SWITCH_ONEOF(var) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
        ++count;
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  KJ_EXPECT(count == 1);

  {
    KJ_SWITCH_ONEOF(kj::cp(var)) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  {
    // At one time this failed to compile.
    const auto& constVar = var;
    KJ_SWITCH_ONEOF(constVar) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }
}